

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void __thiscall proto2_unittest::NonPackedFixed32::Clear(NonPackedFixed32 *this)

{
  anon_union_24_1_493b367e_for_NonPackedFixed32_3 *this_00;
  anon_union_24_1_493b367e_for_NonPackedFixed32_3 aVar1;
  int iVar2;
  bool is_soo;
  
  this_00 = &this->field_0;
  aVar1 = this->field_0;
  if (((undefined1  [24])aVar1 & (undefined1  [24])0x4) != (undefined1  [24])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_);
  }
  is_soo = ((undefined1  [24])aVar1 & (undefined1  [24])0x4) == (undefined1  [24])0x0;
  google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,is_soo);
  iVar2 = google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,is_soo);
  if ((iVar2 != 0) &&
     ((undefined1  [24])((undefined1  [24])*this_00 & (undefined1  [24])0x4) !=
      (undefined1  [24])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_);
  }
  google::protobuf::RepeatedField<unsigned_int>::set_size
            (&(this_00->_impl_).repeated_fixed32_,
             ((undefined1  [24])aVar1 & (undefined1  [24])0x4) == (undefined1  [24])0x0,0);
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void NonPackedFixed32::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.NonPackedFixed32)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_fixed32_.Clear();
  _internal_metadata_.Clear<std::string>();
}